

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void maybe_set_pagemode(QPDF *pdf,string *pagemode)

{
  bool bVar1;
  QPDFObjectHandle root;
  allocator<char> local_51;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  string local_30;
  
  QPDF::getRoot((QPDF *)local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_40 + 0x10),"/PageMode",&local_51);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_50,(string *)local_40);
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_40 + 0x10),"/PageMode",&local_51);
    QPDFObjectHandle::newName((string *)local_50);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_40,(string *)(local_40 + 0x10),(QPDFObjectHandle *)local_50
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    std::__cxx11::string::~string((string *)(local_40 + 0x10));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  return;
}

Assistant:

static void
maybe_set_pagemode(QPDF& pdf, std::string const& pagemode)
{
    auto root = pdf.getRoot();
    if (root.getKey("/PageMode").isNull()) {
        root.replaceKey("/PageMode", QPDFObjectHandle::newName(pagemode));
    }
}